

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.cpp
# Opt level: O3

void __thiscall
tiger::trains::Runner::Runner
          (Runner *this,char *name,char *addr,int port,char *gameName,int playersNum)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Runner = (_func_int **)&PTR__Runner_00182230;
  this->name = name;
  this->addr = addr;
  this->port = port;
  this->gameName = gameName;
  this->playersNum = playersNum;
  memset(&(this->world).commandSender,0,0x308);
  (this->world)._vptr_World = (_func_int **)&PTR__World_00182bc0;
  (this->world).gameOver = false;
  p_Var1 = &(this->world).scoreMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).scoreMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).scoreMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).scoreMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).nameScoreMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).nameScoreMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).nameScoreMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->world).nameScoreMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->world).postMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).postMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).postMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).postMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).playerMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).playerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).playerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).playerMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  p_Var1 = &(this->world).pointMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).pointMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).pointMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).pointMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).lineMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).lineMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).lineMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).lineMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).trainMap._M_t._M_impl.super__Rb_tree_header;
  (this->world).trainMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).trainMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).trainMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).graph._M_t._M_impl.super__Rb_tree_header;
  (this->world).graph._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->world).lineList.
  super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->world).lineList.
  super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->world).pointList.
  super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->world).lineList.
  super__Vector_base<tiger::trains::world::Line_*,_std::allocator<tiger::trains::world::Line_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->world).pointList.
  super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->world).pointList.
  super__Vector_base<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->world).postList.
  super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->world).postList.
  super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->world).trainList.
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->world).postList.
  super__Vector_base<tiger::trains::world::IPost_*,_std::allocator<tiger::trains::world::IPost_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->world).trainList.
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->world).trainList.
  super__Vector_base<tiger::trains::world::Train_*,_std::allocator<tiger::trains::world::Train_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->world).playerList.
  super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->world).playerList.
  super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->world).trainMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->world).playerList.
  super__Vector_base<tiger::trains::world::Player_*,_std::allocator<tiger::trains::world::Player_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->world).graph._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).graph._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).homes._M_t._M_impl.super__Rb_tree_header;
  (this->world).homes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).homes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->world).homes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->world).playerOfName._M_t._M_impl.super__Rb_tree_header;
  (this->world).playerOfName._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).playerOfName._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->world).playerOfName._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->world).postOfPoint._M_t._M_impl.super__Rb_tree_header;
  (this->world).postOfPoint._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).postOfPoint._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->world).postOfPoint._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->world).pointOfPost._M_t._M_impl.super__Rb_tree_header;
  (this->world).pointOfPost._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).pointOfPost._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->world).pointOfPost._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->world).trainsOfLine._M_t._M_impl.super__Rb_tree_header;
  (this->world).trainsOfLine._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).trainsOfLine._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->world).trainsOfLine._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->world).trainsOfPlayer._M_t._M_impl.super__Rb_tree_header;
  (this->world).trainsOfPlayer._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->world).trainsOfPlayer._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->world).trainsOfPlayer._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->world).trainsOfPlayer._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->world).width = 0;
  (this->world).height = 0;
  this->bot = (IBot *)0x0;
  (this->world).eventsHistory.
  super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->world).eventsHistory.
  super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->world).trainsOfPlayer._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->world).eventsHistory.
  super__Vector_base<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>,_std::allocator<std::vector<tiger::trains::world::IEvent_*,_std::allocator<tiger::trains::world::IEvent_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

Runner::Runner(const char *name, const char *addr, int port, const char *gameName, const int playersNum)
    : name(name), addr(addr), port(port), gameName(gameName), playersNum(playersNum), world(),bot(nullptr)
{

}